

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_info.cc
# Opt level: O2

parse_result_t parse_key(X509_INFO *info,uint8_t *data,size_t len,int key_type)

{
  parse_result_t pVar1;
  X509_PKEY *pXVar2;
  EVP_PKEY *pEVar3;
  uint8_t *data_local;
  
  if (info->x_pkey == (X509_PKEY *)0x0) {
    data_local = data;
    pXVar2 = X509_PKEY_new();
    info->x_pkey = (X509_PKEY *)pXVar2;
    if (pXVar2 == (X509_PKEY *)0x0) {
      pVar1 = parse_error;
    }
    else {
      pEVar3 = d2i_PrivateKey(key_type,(EVP_PKEY **)0x0,&data_local,len);
      info->x_pkey->dec_pkey = (EVP_PKEY *)pEVar3;
      pVar1 = (parse_result_t)(pEVar3 == (EVP_PKEY *)0x0);
    }
  }
  else {
    pVar1 = parse_new_entry;
  }
  return pVar1;
}

Assistant:

static enum parse_result_t parse_key(X509_INFO *info, const uint8_t *data,
                                     size_t len, int key_type) {
  if (info->x_pkey != NULL) {
    return parse_new_entry;
  }
  info->x_pkey = X509_PKEY_new();
  if (info->x_pkey == NULL) {
    return parse_error;
  }
  info->x_pkey->dec_pkey = d2i_PrivateKey(key_type, NULL, &data, len);
  return info->x_pkey->dec_pkey != NULL ? parse_ok : parse_error;
}